

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereShortCut(WhereLoopBuilder *pBuilder)

{
  int iCur_00;
  WhereInfo *pWVar1;
  SrcList *pSVar2;
  Table *pTVar3;
  WhereLoop *pWVar4;
  u32 op;
  WhereTerm *pWVar5;
  Index *pIStack_58;
  int opMask;
  Index *pIdx;
  Table *pTab;
  int j;
  int iCur;
  WhereLoop *pLoop;
  WhereTerm *pTerm;
  WhereClause *pWC;
  SrcList_item *pItem;
  WhereInfo *pWInfo;
  WhereLoopBuilder *pBuilder_local;
  
  pWVar1 = pBuilder->pWInfo;
  if ((pWVar1->wctrlFlags & 0x20) == 0) {
    pSVar2 = pWVar1->pTabList;
    pTVar3 = pSVar2->a[0].pTab;
    if (pTVar3->nModuleArg == 0) {
      if (((byte)pSVar2->a[0].fg.field_0x1 >> 1 & 1) == 0) {
        iCur_00 = pSVar2->a[0].iCursor;
        pWVar4 = pBuilder->pNew;
        pWVar4->wsFlags = 0;
        pWVar4->nSkip = 0;
        pWVar5 = sqlite3WhereFindTerm(&pWVar1->sWC,iCur_00,-1,0,0x82,(Index *)0x0);
        if (pWVar5 == (WhereTerm *)0x0) {
          for (pIStack_58 = pTVar3->pIndex; pIStack_58 != (Index *)0x0;
              pIStack_58 = pIStack_58->pNext) {
            if (((pIStack_58->onError != '\0') && (pIStack_58->pPartIdxWhere == (Expr *)0x0)) &&
               (pIStack_58->nKeyCol < 4)) {
              op = 2;
              if ((*(ushort *)&pIStack_58->field_0x63 >> 3 & 1) != 0) {
                op = 0x82;
              }
              pTab._0_4_ = 0;
              while (((int)(uint)pTab < (int)(uint)pIStack_58->nKeyCol &&
                     (pWVar5 = sqlite3WhereFindTerm(&pWVar1->sWC,iCur_00,(uint)pTab,0,op,pIStack_58)
                     , pWVar5 != (WhereTerm *)0x0))) {
                pWVar4->aLTerm[(int)(uint)pTab] = pWVar5;
                pTab._0_4_ = (uint)pTab + 1;
              }
              if ((uint)pTab == pIStack_58->nKeyCol) {
                pWVar4->wsFlags = 0x1201;
                if (((*(ushort *)&pIStack_58->field_0x63 >> 5 & 1) != 0) ||
                   ((pSVar2->a[0].colUsed & pIStack_58->colNotIdxed) == 0)) {
                  pWVar4->wsFlags = pWVar4->wsFlags | 0x40;
                }
                pWVar4->nLTerm = (u16)(uint)pTab;
                (pWVar4->u).btree.nEq = (u16)(uint)pTab;
                (pWVar4->u).btree.pIndex = pIStack_58;
                pWVar4->rRun = 0x27;
                break;
              }
            }
          }
        }
        else {
          pWVar4->wsFlags = 0x1101;
          *pWVar4->aLTerm = pWVar5;
          pWVar4->nLTerm = 1;
          (pWVar4->u).btree.nEq = 1;
          pWVar4->rRun = 0x21;
        }
        if (pWVar4->wsFlags == 0) {
          pBuilder_local._4_4_ = 0;
        }
        else {
          pWVar4->nOut = 1;
          pWVar1->a[0].pWLoop = pWVar4;
          pWVar4->maskSelf = 1;
          pWVar1->a[0].iTabCur = iCur_00;
          pWVar1->nRowOut = 1;
          if (pWVar1->pOrderBy != (ExprList *)0x0) {
            pWVar1->nOBSat = (i8)pWVar1->pOrderBy->nExpr;
          }
          if ((pWVar1->wctrlFlags & 0x100) != 0) {
            pWVar1->eDistinct = '\x01';
          }
          pBuilder_local._4_4_ = 1;
        }
      }
      else {
        pBuilder_local._4_4_ = 0;
      }
    }
    else {
      pBuilder_local._4_4_ = 0;
    }
  }
  else {
    pBuilder_local._4_4_ = 0;
  }
  return pBuilder_local._4_4_;
}

Assistant:

static int whereShortCut(WhereLoopBuilder *pBuilder){
  WhereInfo *pWInfo;
  struct SrcList_item *pItem;
  WhereClause *pWC;
  WhereTerm *pTerm;
  WhereLoop *pLoop;
  int iCur;
  int j;
  Table *pTab;
  Index *pIdx;

  pWInfo = pBuilder->pWInfo;
  if( pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE ) return 0;
  assert( pWInfo->pTabList->nSrc>=1 );
  pItem = pWInfo->pTabList->a;
  pTab = pItem->pTab;
  if( IsVirtual(pTab) ) return 0;
  if( pItem->fg.isIndexedBy ) return 0;
  iCur = pItem->iCursor;
  pWC = &pWInfo->sWC;
  pLoop = pBuilder->pNew;
  pLoop->wsFlags = 0;
  pLoop->nSkip = 0;
  pTerm = sqlite3WhereFindTerm(pWC, iCur, -1, 0, WO_EQ|WO_IS, 0);
  if( pTerm ){
    testcase( pTerm->eOperator & WO_IS );
    pLoop->wsFlags = WHERE_COLUMN_EQ|WHERE_IPK|WHERE_ONEROW;
    pLoop->aLTerm[0] = pTerm;
    pLoop->nLTerm = 1;
    pLoop->u.btree.nEq = 1;
    /* TUNING: Cost of a rowid lookup is 10 */
    pLoop->rRun = 33;  /* 33==sqlite3LogEst(10) */
  }else{
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int opMask;
      assert( pLoop->aLTermSpace==pLoop->aLTerm );
      if( !IsUniqueIndex(pIdx)
       || pIdx->pPartIdxWhere!=0 
       || pIdx->nKeyCol>ArraySize(pLoop->aLTermSpace) 
      ) continue;
      opMask = pIdx->uniqNotNull ? (WO_EQ|WO_IS) : WO_EQ;
      for(j=0; j<pIdx->nKeyCol; j++){
        pTerm = sqlite3WhereFindTerm(pWC, iCur, j, 0, opMask, pIdx);
        if( pTerm==0 ) break;
        testcase( pTerm->eOperator & WO_IS );
        pLoop->aLTerm[j] = pTerm;
      }
      if( j!=pIdx->nKeyCol ) continue;
      pLoop->wsFlags = WHERE_COLUMN_EQ|WHERE_ONEROW|WHERE_INDEXED;
      if( pIdx->isCovering || (pItem->colUsed & pIdx->colNotIdxed)==0 ){
        pLoop->wsFlags |= WHERE_IDX_ONLY;
      }
      pLoop->nLTerm = j;
      pLoop->u.btree.nEq = j;
      pLoop->u.btree.pIndex = pIdx;
      /* TUNING: Cost of a unique index lookup is 15 */
      pLoop->rRun = 39;  /* 39==sqlite3LogEst(15) */
      break;
    }
  }
  if( pLoop->wsFlags ){
    pLoop->nOut = (LogEst)1;
    pWInfo->a[0].pWLoop = pLoop;
    assert( pWInfo->sMaskSet.n==1 && iCur==pWInfo->sMaskSet.ix[0] );
    pLoop->maskSelf = 1; /* sqlite3WhereGetMask(&pWInfo->sMaskSet, iCur); */
    pWInfo->a[0].iTabCur = iCur;
    pWInfo->nRowOut = 1;
    if( pWInfo->pOrderBy ) pWInfo->nOBSat =  pWInfo->pOrderBy->nExpr;
    if( pWInfo->wctrlFlags & WHERE_WANT_DISTINCT ){
      pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
    }
#ifdef SQLITE_DEBUG
    pLoop->cId = '0';
#endif
    return 1;
  }
  return 0;
}